

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_socket.cpp
# Opt level: O2

bool net::TcpSocket::sockConnect(int fd,char *conn_ip,uint16_t conn_port)

{
  int iVar1;
  sockaddr local_28;
  
  if (conn_ip != (char *)0x0) {
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28.sa_family = 2;
    local_28.sa_data._2_4_ = inet_addr(conn_ip);
    local_28.sa_data._0_2_ = conn_port << 8 | conn_port >> 8;
    iVar1 = connect(fd,&local_28,0x10);
    return -1 < iVar1;
  }
  __assert_fail("conn_ip != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/tcp_socket.cpp"
                ,0x8e,"static bool net::TcpSocket::sockConnect(int, const char *, uint16_t)");
}

Assistant:

bool TcpSocket::sockConnect(int fd, const char* conn_ip, uint16_t conn_port)
{
    assert(conn_ip != NULL);
    sockaddr_in conAddr;
    memset(&conAddr, 0, sizeof(struct sockaddr_in));
    conAddr.sin_family = AF_INET;
    conAddr.sin_addr.s_addr = inet_addr(conn_ip);
    conAddr.sin_port = htons(static_cast<uint16_t>(conn_port));
    socklen_t len = sizeof(conAddr);
    int flag = ::connect(fd, (sockaddr*) &conAddr, len);
    return flag >= 0;
}